

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::SubroutineSymbol::inheritDefaultedArgList
          (SubroutineSymbol *this,Scope *scope,Scope *parentScope,SyntaxNode *syntax,
          SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *arguments)

{
  __fn *__fn;
  FormalArgumentSymbol *this_00;
  bool bVar1;
  int iVar2;
  Type *this_01;
  ClassType *pCVar3;
  SubroutineSymbol *this_02;
  Expression *this_03;
  undefined4 extraout_var;
  Diagnostic *this_04;
  SyntaxNode *pSVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  long lVar5;
  byte bVar6;
  ArgList AVar7;
  SourceRange sourceRange;
  LocalVarCheckVisitor visitor;
  LocalVarCheckVisitor local_58;
  
  pCVar3 = (ClassType *)scope->thisSym;
  if ((pCVar3->super_Type).super_Symbol.kind == ClassType) {
    __fn = *(__fn **)&this->super_Symbol;
    pSVar4 = syntax;
    this_01 = ClassType::getBaseClass(pCVar3);
    if (this_01 == (Type *)0x0) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)parentScope);
      this_04 = Scope::addDiag((Scope *)this,(DiagCode)0x2f000a,sourceRange);
      Diagnostic::operator<<(this_04,(pCVar3->super_Type).super_Symbol.name);
      return;
    }
    bVar1 = Type::isClass(this_01);
    if (bVar1) {
      pCVar3 = (ClassType *)Type::getCanonicalType(this_01);
      this_02 = ClassType::getConstructor(pCVar3);
      if (this_02 != (SubroutineSymbol *)0x0) {
        AVar7 = getArguments(this_02);
        bVar6 = 0;
        for (lVar5 = 0; AVar7._M_extent._M_extent_value._M_extent_value << 3 != lVar5;
            lVar5 = lVar5 + 8) {
          this_00 = *(FormalArgumentSymbol **)((long)AVar7._M_ptr + lVar5);
          this_03 = FormalArgumentSymbol::getDefaultValue(this_00);
          __child_stack = extraout_RDX;
          if (((this_03 != (Expression *)0x0) && ((bVar6 & 1) == 0)) &&
             (pSVar4 = (SyntaxNode *)
                       (this_00->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len,
             pSVar4 != (SyntaxNode *)0x0)) {
            local_58.argName._M_str =
                 (this_00->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str;
            local_58.anyErrors = false;
            local_58.scope = (Scope *)this;
            local_58.syntax = (SyntaxNode *)parentScope;
            local_58.argName._M_len = (size_t)pSVar4;
            Expression::visit<slang::ast::LocalVarCheckVisitor&>(this_03,&local_58);
            bVar6 = bVar6 | local_58.anyErrors;
            __child_stack = extraout_RDX_00;
          }
          iVar2 = FormalArgumentSymbol::clone(this_00,__fn,__child_stack,(int)pSVar4,arguments);
          Scope::addMember((Scope *)this,(Symbol *)CONCAT44(extraout_var,iVar2));
          local_58.scope = (Scope *)CONCAT44(extraout_var,iVar2);
          SmallVectorBase<slang::ast::FormalArgumentSymbol_const*>::
          emplace_back<slang::ast::FormalArgumentSymbol_const*>
                    ((SmallVectorBase<slang::ast::FormalArgumentSymbol_const*> *)syntax,
                     (FormalArgumentSymbol **)&local_58);
        }
      }
    }
  }
  return;
}

Assistant:

void SubroutineSymbol::inheritDefaultedArgList(
    Scope& scope, const Scope& parentScope, const SyntaxNode& syntax,
    SmallVectorBase<const FormalArgumentSymbol*>& arguments) {

    auto& comp = scope.getCompilation();
    if (parentScope.asSymbol().kind == SymbolKind::ClassType) {
        auto& ct = parentScope.asSymbol().as<ClassType>();
        auto baseClass = ct.getBaseClass();
        if (!baseClass) {
            scope.addDiag(diag::SuperNoBase, syntax.sourceRange()) << ct.name;
        }
        else if (baseClass->isClass()) {
            // Note: we check isClass() above to skip over cases where
            // the baseClass is the ErrorType.
            auto& baseCt = baseClass->getCanonicalType().as<ClassType>();
            if (auto constructor = baseCt.getConstructor()) {
                // We found the base class's constructor.
                // Pull in all arguments from it.
                bool anyErrors = false;
                for (auto arg : constructor->getArguments()) {
                    // It's an error if any of the inherited arguments
                    // have default values that refer to local members
                    // of the parent class.
                    if (auto defVal = arg->getDefaultValue();
                        !anyErrors && defVal && !arg->name.empty()) {
                        LocalVarCheckVisitor visitor(scope, syntax, arg->name);
                        defVal->visit(visitor);
                        anyErrors |= visitor.anyErrors;
                    }

                    auto& cloned = arg->clone(comp);
                    scope.addMember(cloned);
                    arguments.push_back(&cloned);
                }
            }
        }
    }
}